

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  runtime_error *prVar3;
  bool bVar4;
  string targetPath;
  string sourcePath;
  ifstream inSource;
  stringstream sourceContent;
  ifstream inTarget;
  stringstream targetContent;
  string local_7c8;
  string local_7a8;
  undefined1 *local_788;
  size_t local_780;
  undefined1 local_778 [16];
  undefined1 *local_768;
  size_t local_760;
  undefined1 local_758 [16];
  _Head_base<0UL,_json::JsonNode_*,_false> local_748 [2];
  streambuf local_738 [504];
  undefined1 local_540 [128];
  ios_base aiStack_4c0 [264];
  undefined1 local_3b8 [520];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base aiStack_130 [264];
  
  if (argc < 2) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Provide sufficient arguments");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_7a8,argv[1],(allocator *)local_748);
  std::__cxx11::string::string((string *)&local_7c8,argv[2],(allocator *)local_748);
  json::JsonDocument::createFromFile((JsonDocument *)local_748,&local_7a8);
  json::JsonDocument::saveToFile((JsonDocument *)local_748,&local_7c8,4);
  if (local_748[0]._M_head_impl != (JsonNode *)0x0) {
    (*(local_748[0]._M_head_impl)->_vptr_JsonNode[1])();
  }
  std::ifstream::ifstream(local_748,(string *)&local_7a8,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                   "Could not open file: ",&local_7a8);
    std::runtime_error::runtime_error(prVar3,(string *)local_3b8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_3b8,(string *)&local_7c8,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                   "Could not open file: ",&local_7c8);
    std::runtime_error::runtime_error(prVar3,(string *)local_540);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_540);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::operator<<((ostream *)(local_540 + 0x10),local_738);
  std::ostream::operator<<(local_1a0,(streambuf *)(local_3b8 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  if (local_760 == local_780) {
    if (local_760 == 0) {
      bVar4 = false;
    }
    else {
      iVar2 = bcmp(local_768,local_788,local_760);
      bVar4 = iVar2 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if (local_788 != local_778) {
    operator_delete(local_788);
  }
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  if (!bVar4) {
    std::ifstream::close();
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(aiStack_130);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_540);
    std::ios_base::~ios_base(aiStack_4c0);
    std::ifstream::~ifstream(local_3b8);
    std::ifstream::~ifstream(local_748);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p);
    }
    return 0;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"The two files were not equal");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2)
        throw std::runtime_error("Provide sufficient arguments");

    // The file to parse.
    std::string sourcePath = argv[1];

    // The file we want to write to.
    std::string targetPath = argv[2];

    // Parse the source file and save it to the target file.
    JsonDocument::createFromFile(sourcePath).saveToFile(targetPath);

    std::ifstream inSource(sourcePath);

    if (!inSource.is_open())
        throw std::runtime_error("Could not open file: " + sourcePath);

    std::ifstream inTarget(targetPath);

    if (!inTarget.is_open())
        throw std::runtime_error("Could not open file: " + targetPath);

    std::stringstream sourceContent;
    std::stringstream targetContent;

    // Read the two files.
    sourceContent << inSource.rdbuf();
    targetContent << inTarget.rdbuf();

    // Compare the two files, if the parser works they should be equal.
    if (sourceContent.str() != targetContent.str())
        throw std::runtime_error("The two files were not equal");

    inSource.close();
    inTarget.close();
}